

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simulator.cpp
# Opt level: O3

void * SimulatorThread(void *pParam)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  char *pcVar6;
  FILE *pFVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  ulong extraout_XMM0_Qb;
  double extraout_XMM0_Qb_00;
  ulong extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  double extraout_XMM0_Qb_03;
  undefined8 extraout_XMM0_Qb_04;
  double extraout_XMM0_Qb_05;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined4 uVar17;
  double dVar18;
  CHRONO chrono;
  char logsimufilename [256];
  double dStack_3c0;
  double local_3b8;
  undefined8 uStack_3b0;
  double local_3a8;
  double local_3a0;
  double local_398;
  double dStack_390;
  double local_388;
  double dStack_380;
  double local_370;
  double local_368;
  double local_358;
  ulong uStack_350;
  double local_348;
  double dStack_340;
  double local_338;
  FILE *local_330;
  double local_328;
  interval local_320;
  undefined1 local_308 [16];
  undefined1 local_2f8 [12];
  undefined4 uStack_2ec;
  interval local_2e0;
  interval local_2c8;
  double local_2b0;
  double local_2a8;
  double local_2a0;
  timeval local_298;
  double local_288;
  timespec local_280;
  double local_270;
  double dStack_268;
  double local_260;
  double dStack_258;
  timespec local_250;
  int local_240;
  double local_238;
  double local_228;
  undefined8 uStack_220;
  double local_218;
  vector<double,_std::allocator<double>_> local_200;
  vector<double,_std::allocator<double>_> local_1e8;
  vector<double,_std::allocator<double>_> local_1d0;
  vector<double,_std::allocator<double>_> local_1b8;
  vector<double,_std::allocator<double>_> local_1a0;
  vector<double,_std::allocator<double>_> local_188;
  vector<double,_std::allocator<double>_> local_170;
  double local_158;
  double local_148;
  char local_138 [264];
  
  if (bDisablelogsimu == 0) {
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar6 = strtimeex_fns();
    sprintf(local_138,"log/logsimu_%.64s.csv",pcVar6);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    pFVar7 = fopen(local_138,"w");
    if (pFVar7 == (FILE *)0x0) {
      puts("Unable to create log file.");
      goto LAB_00190cdb;
    }
    fwrite("t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;EPU1;EPU2;\n"
           ,0x260,1,pFVar7);
    fflush(pFVar7);
  }
  else {
    pFVar7 = (FILE *)0x0;
  }
  GNSSqualitySimulator = 0;
  x_sim = x_0;
  y_sim = y_0;
  z_sim = z_0;
  phi_sim = phi_0;
  theta_sim = theta_0;
  psi_sim = psi_0;
  vrx_sim = vrx_0;
  vry_sim = vry_0;
  vrz_sim = vrz_0;
  omegax_sim = omegax_0;
  omegay_sim = omegay_0;
  omegaz_sim = omegaz_0;
  alpha_mes_simulator = alpha_0;
  d_sim = d_0;
  iVar1 = clock_getres(4,&local_250);
  if ((iVar1 == 0) && (iVar1 = clock_gettime(4,&local_280), iVar1 == 0)) {
    local_240 = 0;
    local_270 = 0.0;
    dStack_268 = 0.0;
    local_260 = 0.0;
    dStack_258 = 0.0;
  }
  dVar9 = local_260;
  dVar8 = dStack_258;
  if (local_240 == 0) {
    iVar1 = clock_gettime(4,(timespec *)&local_320);
    dVar8 = 0.0;
    if (iVar1 == 0) {
      dVar9 = (double)((((long)local_320.inf + (long)local_260) - local_280.tv_sec) +
                      ((long)local_320.sup + (long)dStack_258) / 1000000000);
      dVar8 = (double)(((long)local_320.sup + (long)dStack_258) % 1000000000 - local_280.tv_nsec);
      if ((long)dVar8 < 0) {
        dVar9 = (double)((long)dVar9 + ~((ulong)-(long)dVar8 / 1000000000));
        dVar8 = (double)((long)dVar8 + 1000000000 + ((ulong)-(long)dVar8 / 1000000000) * 1000000000)
        ;
      }
      goto LAB_0018c3e3;
    }
  }
  else {
LAB_0018c3e3:
    dVar8 = (double)(long)dVar8 / 1000000000.0 + (double)(long)dVar9;
  }
  local_2a8 = 0.0;
  local_330 = pFVar7;
  do {
    local_320.inf = (double)(long)(simulatorperiod / 1000);
    local_320.sup = (double)(long)(((simulatorperiod * 1000) % 1000000) * 1000);
    nanosleep((timespec *)&local_320,(timespec *)0x0);
    dVar16 = local_260;
    dVar9 = dStack_258;
    if (local_240 == 0) {
      iVar1 = clock_gettime(4,(timespec *)&local_320);
      local_2b0 = dVar8;
      if (iVar1 == 0) {
        dVar16 = (double)((((long)local_320.inf + (long)local_260) - local_280.tv_sec) +
                         ((long)local_320.sup + (long)dStack_258) / 1000000000);
        dVar9 = (double)(((long)local_320.sup + (long)dStack_258) % 1000000000 - local_280.tv_nsec);
        if ((long)dVar9 < 0) {
          dVar16 = (double)((long)dVar16 + ~((ulong)-(long)dVar9 / 1000000000));
          dVar9 = (double)((long)dVar9 + 1000000000 +
                          ((ulong)-(long)dVar9 / 1000000000) * 1000000000);
        }
        goto LAB_0018c4ce;
      }
    }
    else {
LAB_0018c4ce:
      local_2b0 = (double)(long)dVar9 / 1000000000.0 + (double)(long)dVar16;
    }
    iVar1 = gettimeofday(&local_298,(__timezone_ptr_t)0x0);
    if (iVar1 == 0) {
      local_288 = (double)local_298.tv_sec;
      local_2a0 = (double)local_298.tv_usec;
    }
    else {
      local_298.tv_sec = 0;
      local_298.tv_usec = 0;
      local_2a0 = 0.0;
      local_288 = 0.0;
    }
    dVar8 = local_2b0 - dVar8;
    local_2a0 = local_2a0 * 1e-06;
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    local_370 = vtwind_med;
    local_348 = vtwind_var;
    iVar1 = rand();
    local_308._0_8_ = psitwind_med;
    local_388 = psitwind_var;
    iVar2 = rand();
    dVar16 = vc_var;
    local_368 = vc_med;
    iVar3 = rand();
    dVar18 = psic_var;
    local_358 = psic_med;
    iVar4 = rand();
    local_398 = hw_var;
    iVar5 = rand();
    dVar9 = vrx_sim;
    pFVar7 = local_330;
    if (robid < 0x10000) {
      dVar16 = dVar16 * (((double)iVar3 + (double)iVar3) / 2147483647.0 + -1.0) + local_368;
      dVar18 = dVar18 * (((double)iVar4 + (double)iVar4) / 2147483647.0 + -1.0) + local_358;
      dVar9 = local_398 * (((double)iVar5 + (double)iVar5) / 2147483647.0 + -1.0);
      if (robid == 1) {
        local_388 = vrx_sim;
        dStack_380 = 0.0;
        local_398 = dVar9;
        local_348 = cos(psi_sim);
        local_368 = cos(dVar18);
        dStack_380 = vrx_sim;
        local_358 = sin(psi_sim);
        uStack_350 = extraout_XMM0_Qb;
        dVar9 = sin(dVar18);
        dVar13 = phi_sim;
        dVar12 = phi_bias_err;
        dVar18 = phi_max_rand_err;
        local_348 = local_348 * local_388 + local_368 * dVar16;
        local_388 = local_358 * dStack_380 + dVar9 * dVar16;
        x_sim = dVar8 * local_348 + x_sim;
        y_sim = dVar8 * local_388 + y_sim;
        dVar9 = (u3 * alphaz + vzup) * dVar8 + z_sim;
        z_sim = 0.0;
        if (dVar9 <= 0.0) {
          z_sim = dVar9;
        }
        psi_sim = (u1 - u2) * alphaomegaz * dVar8 + psi_sim;
        vrx_sim = ((u1 + u2) * alphavrx - alphafvrx * vrx_sim) * dVar8 + vrx_sim;
        dStack_380 = local_388;
        dStack_340 = local_388;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar18 + dVar12 +
                    dVar13;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -phi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&phi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&phi_ahrs,&local_320);
        dVar16 = theta_sim;
        dVar9 = theta_bias_err;
        dVar8 = theta_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -theta_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&theta_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&theta_ahrs,&local_320);
        dVar16 = psi_sim;
        dVar9 = psi_bias_err;
        dVar8 = psi_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -psi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&psi_ahrs,&local_320);
        dVar8 = z_max_rand_err;
        dVar9 = z_sim + z_bias_err;
        iVar1 = rand();
        local_3a0 = local_398 +
                    (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -z_pressure_acc;
        interval::interval(&local_2e0,&local_3a8,&z_pressure_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&z_pressure,&local_320);
        if ((bEnableSimulatedGNSS == 0) ||
           (((bNoSimGNSSInsideObstacles != 0 &&
             (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar8)) ||
            (dVar8 = x_sim, dVar16 = x_bias_err, dVar9 = x_max_rand_err,
            z_sim < GPS_submarine_depth_limit)))) {
          GNSSqualitySimulator = 0;
        }
        else {
          GNSSqualitySimulator = 1;
          iVar1 = rand();
          dVar12 = y_sim;
          dVar18 = y_bias_err;
          dVar8 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 + dVar8;
          local_398 = y_max_rand_err;
          iVar1 = rand();
          local_308._0_8_ =
               (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar18 + dVar12
          ;
          local_358 = x_max_rand_err * 5.0;
          iVar1 = rand();
          dVar9 = angle_env;
          local_368 = lat_env;
          local_370 = long_env;
          local_398 = alt_env;
          dVar16 = cos(angle_env);
          local_2f8._0_8_ = dVar16;
          local_338 = sin(dVar9);
          dVar16 = sin(dVar9);
          dVar9 = cos(dVar9);
          dVar16 = ((dVar16 * dVar8 + dVar9 * (double)local_308._0_8_) / 6371000.0) *
                   57.29577951308232 + local_368;
          dVar9 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar16 + -90.0)) &&
             (dVar9 = 0.0, 2.220446049250313e-16 <= ABS(dVar16 + 90.0))) {
            dVar18 = (double)local_308._0_8_ * local_338;
            dVar8 = dVar8 * (double)local_2f8._0_8_;
            dVar9 = cos(dVar16 * 0.017453292519943295);
            dVar9 = local_370 + (((dVar8 - dVar18) / 6371000.0) * 57.29577951308232) / dVar9;
          }
          ComputeGNSSPosition(dVar16,dVar9,
                              local_398 +
                              local_358 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) +
                              0.0,GNSSqualitySimulator,0,0.0);
          sog = SQRT(dStack_340 * dStack_340 + local_348 * local_348);
          local_3a0 = atan2(local_388,local_348);
          interval::interval(&local_2c8,&local_3a0);
          local_3a8 = -3.141592653589793;
          local_328 = 3.141592653589793;
          interval::interval(&local_2e0,&local_3a8,&local_328);
          operator+(&local_2c8,&local_2e0);
          interval::operator=((interval *)&cog_gps,&local_320);
        }
        dVar8 = vrx_sim;
        dVar16 = vrx_bias_err;
        dVar9 = vrx_max_rand_err;
        if (bEnableSimulatedDVL == 0) {
          local_2c8.inf = -10000.0;
          local_2e0.inf = 10000.0;
          interval::interval(&local_320,&local_2c8.inf,&local_2e0.inf);
          interval::operator=((interval *)&vrx_dvl,&local_320);
          local_2c8.inf = -10000.0;
          local_2e0.inf = 10000.0;
          interval::interval(&local_320,&local_2c8.inf,&local_2e0.inf);
          interval::operator=((interval *)&vry_dvl,&local_320);
          local_2c8.inf = -10000.0;
          local_2e0.inf = 10000.0;
        }
        else {
          iVar1 = rand();
          dVar12 = vry_sim;
          dVar18 = vry_bias_err;
          dVar8 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 + dVar8;
          local_398 = vry_max_rand_err;
          iVar1 = rand();
          dVar9 = vrz_sim;
          dVar12 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar18 +
                   dVar12;
          local_398 = vrz_bias_err;
          local_388 = vrz_max_rand_err;
          iVar1 = rand();
          dVar9 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_388 + local_398 +
                  dVar9;
          local_2c8.inf = dVar8 - dvl_acc;
          local_2e0.inf = dVar8 + dvl_acc;
          interval::interval(&local_320,&local_2c8.inf,&local_2e0.inf);
          interval::operator=((interval *)&vrx_dvl,&local_320);
          local_2c8.inf = dVar12 - dvl_acc;
          local_2e0.inf = dVar12 + dvl_acc;
          interval::interval(&local_320,&local_2c8.inf,&local_2e0.inf);
          interval::operator=((interval *)&vry_dvl,&local_320);
          local_2c8.inf = dVar9 - dvl_acc;
          local_2e0.inf = dVar9 + dvl_acc;
        }
        interval::interval(&local_320,&local_2c8.inf,&local_2e0.inf);
        interval::operator=((interval *)&vrz_dvl,&local_320);
        pFVar7 = local_330;
      }
      else if (robid == 0x100) {
        local_388 = vrx_sim;
        dStack_380 = 0.0;
        local_348 = cos(psi_sim);
        dStack_340 = extraout_XMM0_Qb_00;
        local_398 = cos(alphaomegaz * uw);
        local_358 = cos(dVar18);
        dStack_380 = vrx_sim;
        uStack_350 = extraout_XMM0_Qb_01;
        local_308._0_8_ = sin(psi_sim);
        local_308._8_8_ = extraout_XMM0_Qb_02;
        local_368 = cos(alphaomegaz * uw);
        dVar9 = sin(dVar18);
        dVar12 = vrx_sim;
        local_398 = local_398 * local_348 * local_388 + local_358 * dVar16;
        dStack_390 = local_368 * (double)local_308._0_8_ * dStack_380 + dVar9 * dVar16;
        dVar13 = sin(alphaomegaz * uw);
        dVar18 = phi_sim;
        dVar16 = phi_bias_err;
        dVar9 = phi_max_rand_err;
        x_sim = dVar8 * local_398 + x_sim;
        local_388 = dStack_390;
        dStack_380 = dStack_390;
        y_sim = dVar8 * dStack_390 + y_sim;
        psi_sim = ((dVar13 * dVar12) / alphaz) * dVar8 + psi_sim;
        vrx_sim = (u * alphavrx - alphafvrx * vrx_sim) * dVar8 + vrx_sim;
        vry_sim = vry_sim * -0.1 * dVar8 + vry_sim;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 +
                    dVar18;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -phi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&phi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&phi_ahrs,&local_320);
        dVar16 = theta_sim;
        dVar9 = theta_bias_err;
        dVar8 = theta_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -theta_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&theta_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&theta_ahrs,&local_320);
        dVar16 = psi_sim;
        dVar9 = psi_bias_err;
        dVar8 = psi_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -psi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&psi_ahrs,&local_320);
        pFVar7 = local_330;
        if ((bEnableSimulatedGNSS == 0) ||
           ((bNoSimGNSSInsideObstacles != 0 &&
            (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar8)))) {
          GNSSqualitySimulator = 0;
        }
        else {
          dVar8 = x_sim;
          dVar16 = x_bias_err;
          dVar9 = x_max_rand_err;
          GNSSqualitySimulator = 1;
          iVar1 = rand();
          dVar12 = y_sim;
          dVar18 = y_bias_err;
          dVar8 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 + dVar8;
          local_348 = y_max_rand_err;
          iVar1 = rand();
          local_308._0_8_ =
               (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_348 + dVar18 + dVar12
          ;
          local_358 = x_max_rand_err * 5.0;
          iVar1 = rand();
          dVar9 = angle_env;
          local_368 = lat_env;
          local_370 = long_env;
          local_348 = alt_env;
          dVar16 = cos(angle_env);
          local_2f8._0_8_ = dVar16;
          local_338 = sin(dVar9);
          dVar16 = sin(dVar9);
          dVar9 = cos(dVar9);
          dVar16 = ((dVar16 * dVar8 + dVar9 * (double)local_308._0_8_) / 6371000.0) *
                   57.29577951308232 + local_368;
          dVar9 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar16 + -90.0)) &&
             (dVar9 = 0.0, 2.220446049250313e-16 <= ABS(dVar16 + 90.0))) {
            dVar18 = (double)local_308._0_8_ * local_338;
            dVar8 = dVar8 * (double)local_2f8._0_8_;
            dVar9 = cos(dVar16 * 0.017453292519943295);
            dVar9 = local_370 + (((dVar8 - dVar18) / 6371000.0) * 57.29577951308232) / dVar9;
          }
          ComputeGNSSPosition(dVar16,dVar9,
                              local_348 +
                              local_358 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) +
                              0.0,GNSSqualitySimulator,0,0.0);
          sog = SQRT(dStack_390 * dStack_390 + local_398 * local_398);
          local_3a0 = atan2(local_388,local_398);
          interval::interval(&local_2c8,&local_3a0);
          local_3a8 = -3.141592653589793;
          local_328 = 3.141592653589793;
          interval::interval(&local_2e0,&local_3a8,&local_328);
          operator+(&local_2c8,&local_2e0);
          interval::operator=((interval *)&cog_gps,&local_320);
          pFVar7 = local_330;
        }
      }
      else if (robid == 0x1000) {
        local_348 = local_348 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) + local_370;
        local_388 = local_388 * (((double)iVar2 + (double)iVar2) / 2147483647.0 + -1.0) +
                    (double)local_308._0_8_;
        local_370 = alphaomegaz * uw;
        local_358 = u * 0.8999999999999999 + 0.3;
        uStack_350 = 0;
        local_398 = dVar9;
        local_368 = cos(psi_sim - local_388);
        dVar9 = cos(local_358);
        if (0.0 <= dVar9 + local_368) {
          dVar9 = sin(psi_sim - local_388);
          if (dVar9 <= 0.0) {
            local_358 = -local_358;
            uStack_350 = uStack_350 ^ 0x8000000000000000;
          }
        }
        else {
          local_358 = (3.141592653589793 - psi_sim) + local_388;
          uStack_350 = 0;
        }
        local_368 = alphaz * vrx_sim;
        local_338 = sin(local_370);
        local_338 = local_338 * local_368;
        local_368 = alphavrx * local_348;
        dVar9 = sin((psi_sim + local_358) - local_388);
        local_368 = dVar9 * local_368;
        stack0xfffffffffffffd10 = 0.0;
        local_2f8._0_8_ = vrx_sim;
        local_218 = cos(psi_sim);
        local_228 = local_348 * 0.01;
        uStack_220 = 0;
        local_238 = cos(local_388);
        local_308._0_8_ = cos(dVar18);
        local_308._8_8_ = extraout_XMM0_Qb_04;
        local_2f8._8_4_ = SUB84(vrx_sim,0);
        uStack_2ec = (int)((ulong)vrx_sim >> 0x20);
        local_148 = sin(psi_sim);
        local_158 = sin(local_388);
        dVar9 = sin(dVar18);
        dVar9 = dVar9 * dVar16 + local_148 * stack0xfffffffffffffd10 + local_158 * local_228;
        local_308._8_4_ = SUB84(dVar9,0);
        local_308._0_8_ =
             (double)local_308._0_8_ * dVar16 +
             local_218 * (double)local_2f8._0_8_ + local_238 * local_228;
        local_308._12_4_ = (int)((ulong)dVar9 >> 0x20);
        dVar9 = sin(local_358);
        dVar16 = sin(local_370);
        x_sim = dVar8 * local_308._0_8_ + x_sim;
        local_2f8._8_4_ = local_308._8_4_;
        local_2f8._0_8_ = local_308._8_8_;
        uStack_2ec = local_308._12_4_;
        y_sim = dVar8 * local_308._8_8_ + y_sim;
        vrx_sim = ((dVar9 * local_368 - dVar16 * local_338) - alphafvrx * vrx_sim * vrx_sim) *
                  0.0035714285714285713 * dVar8 + vrx_sim;
        psi_sim = omegaz_sim * dVar8 + psi_sim;
        dVar9 = cos(local_358);
        dVar16 = cos(local_370);
        omegaz_sim = (local_398 * 100.0 +
                     (((dVar9 * -0.5 + 0.5) * local_368 + dVar16 * -1.5 * local_338) -
                     alphafomegaz * omegaz_sim)) * 0.02 * dVar8 + omegaz_sim;
        dVar18 = local_2a8 * -40.0;
        local_368 = local_368 * 2.1;
        dVar12 = cos(local_358);
        dVar12 = dVar12 * local_368;
        local_398 = cos(phi_sim);
        dStack_390 = extraout_XMM0_Qb_05;
        dVar13 = sin(phi_sim);
        dVar16 = phi_bias_err;
        dVar9 = phi_max_rand_err;
        auVar14._0_8_ = local_398 * dVar12;
        auVar14._8_8_ = dVar13 * 549.36;
        auVar15 = divpd(auVar14,_DAT_001ded50);
        local_2a8 = local_2a8 + ((dVar18 / 15.0 + auVar15._0_8_) - auVar15._8_8_) * dVar8;
        dVar8 = dVar8 * local_2a8 + phi_sim;
        phi_sim = dVar8;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 + dVar8
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -phi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&phi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&phi_ahrs,&local_320);
        dVar16 = theta_sim;
        dVar9 = theta_bias_err;
        dVar8 = theta_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -theta_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&theta_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&theta_ahrs,&local_320);
        dVar16 = psi_sim;
        dVar9 = psi_bias_err;
        dVar8 = psi_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16
        ;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -psi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&psi_ahrs,&local_320);
        if ((bEnableSimulatedGNSS == 0) ||
           ((bNoSimGNSSInsideObstacles != 0 &&
            (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar8)))) goto LAB_0018f613;
        dVar8 = x_sim;
        dVar16 = x_bias_err;
        dVar9 = x_max_rand_err;
        GNSSqualitySimulator = 1;
        iVar1 = rand();
        dVar12 = y_sim;
        dVar18 = y_bias_err;
        dVar8 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16 + dVar8;
        local_398 = y_max_rand_err;
        iVar1 = rand();
        local_370 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar18 +
                    dVar12;
        dVar16 = x_max_rand_err * 5.0;
        iVar1 = rand();
        dVar9 = angle_env;
        local_398 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar16 + 0.0;
        local_338 = lat_env;
        local_218 = long_env;
        local_368 = alt_env;
        local_228 = cos(angle_env);
        local_238 = sin(dVar9);
        dVar16 = sin(dVar9);
        dVar9 = cos(dVar9);
        dVar9 = ((dVar16 * dVar8 + dVar9 * local_370) / 6371000.0) * 57.29577951308232 + local_338;
        if (2.220446049250313e-16 <= ABS(dVar9 + -90.0)) {
          dVar16 = 0.0;
          if (2.220446049250313e-16 <= ABS(dVar9 + 90.0)) {
            dVar18 = local_370 * local_238;
            dVar8 = dVar8 * local_228;
            dVar16 = cos(dVar9 * 0.017453292519943295);
            dVar16 = local_218 + (((dVar8 - dVar18) / 6371000.0) * 57.29577951308232) / dVar16;
          }
        }
        else {
          dVar16 = 0.0;
        }
        ComputeGNSSPosition(dVar9,dVar16,local_368 + local_398,GNSSqualitySimulator,0,0.0);
        sog = SQRT((double)local_308._8_8_ * (double)local_308._8_8_ +
                   (double)local_308._0_8_ * (double)local_308._0_8_);
        local_3a0 = atan2((double)local_2f8._0_8_,(double)local_308._0_8_);
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -3.141592653589793;
        local_328 = 3.141592653589793;
        interval::interval(&local_2e0,&local_3a8,&local_328);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&cog_gps,&local_320);
        dVar8 = fmod((((-angle_env - (local_358 + psi_sim)) + 1.5707963267948966) * 180.0) /
                     3.141592653589793,360.0);
        sailangle = fmod(dVar8 + 360.0,360.0);
        dVar8 = psitwind_var;
        iVar1 = rand();
        dVar9 = psitwind_var;
        psitwind = local_388 + (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + 0.0
        ;
        iVar1 = rand();
        vtwind = local_348 + (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + 0.0;
        pFVar7 = local_330;
      }
    }
    else if (robid == 0x10000) {
      dVar16 = alphavrx * u;
      vrx_sim = dVar16;
      dVar9 = cos(psi_sim);
      dVar18 = vrx_sim;
      dVar9 = dVar9 * dVar16;
      local_388 = sin(psi_sim);
      dVar16 = psi_bias_err;
      local_388 = local_388 * dVar18;
      x_sim = dVar8 * dVar9 + x_sim;
      y_sim = dVar8 * local_388 + y_sim;
      dVar8 = uw * alphaomegaz * dVar8 + psi_sim;
      local_398 = psi_max_rand_err;
      psi_sim = dVar8;
      iVar1 = rand();
      local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar16 +
                  dVar8;
      interval::interval(&local_2c8,&local_3a0);
      local_3a8 = -psi_ahrs_acc;
      interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
      operator+(&local_2c8,&local_2e0);
      interval::operator=((interval *)&psi_ahrs,&local_320);
      pFVar7 = local_330;
      if ((bEnableSimulatedGNSS == 0) ||
         ((bNoSimGNSSInsideObstacles != 0 &&
          (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), 0.0 <= dVar8)))) {
        GNSSqualitySimulator = 0;
      }
      else {
        dVar18 = x_sim;
        dVar8 = x_bias_err;
        GNSSqualitySimulator = 1;
        local_398 = x_max_rand_err;
        iVar1 = rand();
        dVar12 = y_sim;
        dVar16 = y_bias_err;
        local_398 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar8 +
                    dVar18;
        local_348 = y_max_rand_err;
        iVar1 = rand();
        local_308._0_8_ =
             (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_348 + dVar16 + dVar12;
        local_358 = x_max_rand_err * 5.0;
        iVar1 = rand();
        dVar8 = angle_env;
        local_368 = lat_env;
        local_370 = long_env;
        local_348 = alt_env;
        dVar16 = cos(angle_env);
        local_2f8._0_8_ = dVar16;
        local_338 = sin(dVar8);
        dVar16 = sin(dVar8);
        dVar8 = cos(dVar8);
        dVar16 = ((dVar16 * local_398 + dVar8 * (double)local_308._0_8_) / 6371000.0) *
                 57.29577951308232 + local_368;
        dVar8 = 0.0;
        if ((2.220446049250313e-16 <= ABS(dVar16 + -90.0)) &&
           (dVar8 = 0.0, 2.220446049250313e-16 <= ABS(dVar16 + 90.0))) {
          local_398 = ((local_398 * (double)local_2f8._0_8_ - (double)local_308._0_8_ * local_338) /
                      6371000.0) * 57.29577951308232;
          dVar8 = cos(dVar16 * 0.017453292519943295);
          dVar8 = local_370 + local_398 / dVar8;
        }
        ComputeGNSSPosition(dVar16,dVar8,
                            local_348 +
                            local_358 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) +
                            0.0,GNSSqualitySimulator,0,0.0);
        dVar16 = dVar9 * dVar9;
        dVar8 = local_388;
LAB_0018dbe5:
        dVar16 = dVar8 * dVar8 + dVar16;
LAB_0018eace:
        sog = SQRT(dVar16);
        local_3a0 = atan2(dVar8,dVar9);
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -3.141592653589793;
        local_328 = 3.141592653589793;
        interval::interval(&local_2e0,&local_3a8,&local_328);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&cog_gps,&local_320);
        pFVar7 = local_330;
      }
    }
    else {
      if (robid == 0x100000) {
        local_3b8 = alphavrx * u;
        vrx_sim = local_3b8;
        local_398 = cos(psi_sim);
        dStack_390 = extraout_XMM0_Qb_03;
        dVar9 = cos(alphaomegaz * uw);
        uStack_3b0._0_4_ = SUB84(vrx_sim,0);
        uStack_3b0._4_4_ = (int)((ulong)vrx_sim >> 0x20);
        local_388 = sin(psi_sim);
        dVar16 = cos(alphaomegaz * uw);
        dVar18 = vrx_sim;
        dVar9 = dVar9 * local_398 * local_3b8;
        dVar16 = dVar16 * local_388 * uStack_3b0;
        auVar15._8_4_ = SUB84(dVar16,0);
        auVar15._0_8_ = dVar9;
        auVar15._12_4_ = (int)((ulong)dVar16 >> 0x20);
        dVar12 = sin(alphaomegaz * uw);
        dVar16 = psi_bias_err;
        dStack_3c0 = auVar15._8_8_;
        x_sim = dVar8 * dVar9 + x_sim;
        local_388 = dStack_3c0;
        dStack_380 = dStack_3c0;
        y_sim = dVar8 * dStack_3c0 + y_sim;
        dVar8 = ((dVar12 * dVar18) / alphaz) * dVar8 + psi_sim;
        local_398 = psi_max_rand_err;
        psi_sim = dVar8;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar16 +
                    dVar8;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -psi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&psi_ahrs,&local_320);
        if ((bEnableSimulatedGNSS != 0) &&
           ((bNoSimGNSSInsideObstacles == 0 ||
            (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), dVar8 < 0.0)))) {
          dVar18 = x_sim;
          dVar8 = x_bias_err;
          GNSSqualitySimulator = 1;
          local_398 = x_max_rand_err;
          iVar1 = rand();
          dVar12 = y_sim;
          dVar16 = y_bias_err;
          local_398 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_398 + dVar8 +
                      dVar18;
          local_348 = y_max_rand_err;
          iVar1 = rand();
          local_308._0_8_ =
               (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_348 + dVar16 + dVar12
          ;
          local_358 = x_max_rand_err * 5.0;
          iVar1 = rand();
          dVar8 = angle_env;
          local_368 = lat_env;
          local_370 = long_env;
          local_348 = alt_env;
          dVar16 = cos(angle_env);
          local_2f8._0_8_ = dVar16;
          local_338 = sin(dVar8);
          dVar16 = sin(dVar8);
          dVar8 = cos(dVar8);
          dVar16 = ((dVar16 * local_398 + dVar8 * (double)local_308._0_8_) / 6371000.0) *
                   57.29577951308232 + local_368;
          dVar8 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar16 + -90.0)) &&
             (dVar8 = 0.0, 2.220446049250313e-16 <= ABS(dVar16 + 90.0))) {
            local_398 = ((local_398 * (double)local_2f8._0_8_ - (double)local_308._0_8_ * local_338)
                        / 6371000.0) * 57.29577951308232;
            dVar8 = cos(dVar16 * 0.017453292519943295);
            dVar8 = local_370 + local_398 / dVar8;
          }
          ComputeGNSSPosition(dVar16,dVar8,
                              local_348 +
                              local_358 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) +
                              0.0,GNSSqualitySimulator,0,0.0);
          dVar16 = dStack_3c0 * dStack_3c0 + dVar9 * dVar9;
          dVar8 = local_388;
          goto LAB_0018eace;
        }
      }
      else {
        if (robid != 0x1000000) goto LAB_0019003c;
        local_348 = u3 * alphaz;
        local_398 = vry_sim;
        local_388 = alphaomegaz * uw;
        local_358 = alphavrx * u;
        dVar16 = cos(psi_sim);
        local_368 = ul * alphavrx;
        dVar13 = sin(psi_sim);
        dVar13 = dVar13 * local_368;
        dVar16 = dVar16 * local_358;
        dVar10 = alphafvrx * vrx_sim;
        local_358 = alphavrx * u;
        local_368 = sin(psi_sim);
        local_308._0_8_ = alphavrx * ul;
        dVar11 = cos(psi_sim);
        dVar12 = phi_sim;
        dVar18 = phi_bias_err;
        x_sim = dVar8 * dVar9 + x_sim;
        y_sim = dVar8 * local_398 + y_sim;
        z_sim = local_348 * dVar8 + z_sim;
        psi_sim = local_388 * dVar8 + psi_sim;
        vrx_sim = ((dVar16 - dVar13) - dVar10) * dVar8 + vrx_sim;
        vry_sim = (vry_sim * -0.1 + local_368 * local_358 + dVar11 * (double)local_308._0_8_) *
                  dVar8 + vry_sim;
        local_388 = phi_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_388 + dVar18 +
                    dVar12;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -phi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&phi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&phi_ahrs,&local_320);
        dVar16 = theta_sim;
        dVar8 = theta_bias_err;
        local_388 = theta_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_388 + dVar8 +
                    dVar16;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -theta_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&theta_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&theta_ahrs,&local_320);
        dVar16 = psi_sim;
        dVar8 = psi_bias_err;
        local_388 = psi_max_rand_err;
        iVar1 = rand();
        local_3a0 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_388 + dVar8 +
                    dVar16;
        interval::interval(&local_2c8,&local_3a0);
        local_3a8 = -psi_ahrs_acc;
        interval::interval(&local_2e0,&local_3a8,&psi_ahrs_acc);
        operator+(&local_2c8,&local_2e0);
        interval::operator=((interval *)&psi_ahrs,&local_320);
        if ((bEnableSimulatedGNSS != 0) &&
           ((bNoSimGNSSInsideObstacles == 0 ||
            (dVar8 = CheckInsideObstacle(x_sim,y_sim,false), dVar8 < 0.0)))) {
          dVar18 = x_sim;
          dVar8 = x_bias_err;
          GNSSqualitySimulator = 1;
          local_388 = x_max_rand_err;
          iVar1 = rand();
          dVar12 = y_sim;
          dVar16 = y_bias_err;
          local_388 = (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_388 + dVar8 +
                      dVar18;
          local_348 = y_max_rand_err;
          iVar1 = rand();
          local_308._0_8_ =
               (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * local_348 + dVar16 + dVar12
          ;
          local_358 = x_max_rand_err * 5.0;
          iVar1 = rand();
          dVar8 = angle_env;
          local_368 = lat_env;
          local_370 = long_env;
          local_348 = alt_env;
          dVar16 = cos(angle_env);
          local_2f8._0_8_ = dVar16;
          local_338 = sin(dVar8);
          dVar16 = sin(dVar8);
          dVar8 = cos(dVar8);
          dVar16 = ((dVar16 * local_388 + dVar8 * (double)local_308._0_8_) / 6371000.0) *
                   57.29577951308232 + local_368;
          dVar8 = 0.0;
          if ((2.220446049250313e-16 <= ABS(dVar16 + -90.0)) &&
             (dVar8 = 0.0, 2.220446049250313e-16 <= ABS(dVar16 + 90.0))) {
            local_388 = ((local_388 * (double)local_2f8._0_8_ - (double)local_308._0_8_ * local_338)
                        / 6371000.0) * 57.29577951308232;
            dVar8 = cos(dVar16 * 0.017453292519943295);
            dVar8 = local_370 + local_388 / dVar8;
          }
          ComputeGNSSPosition(dVar16,dVar8,
                              local_348 +
                              local_358 * (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) +
                              0.0,GNSSqualitySimulator,0,0.0);
          dVar16 = dVar9 * dVar9;
          dVar8 = local_398;
          goto LAB_0018dbe5;
        }
      }
LAB_0018f613:
      GNSSqualitySimulator = 0;
      pFVar7 = local_330;
    }
LAB_0019003c:
    dVar16 = alpha_bias_err;
    dVar9 = alpha_max_rand_err;
    dVar8 = ((double)simulatorperiod / 1000.0) * omegas + alpha_mes_simulator;
    if (alpha_0 + 6.283185307179586 < dVar8) {
      dVar8 = alpha_0;
    }
    alpha_mes_simulator = dVar8;
    iVar1 = rand();
    dVar12 = y_sim;
    dVar18 = x_sim;
    alpha_sim = dVar8 - ((((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar9 + dVar16);
    dVar8 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_1b8,&walls_xa);
    std::vector<double,_std::allocator<double>_>::vector(&local_1d0,&walls_ya);
    std::vector<double,_std::allocator<double>_>::vector(&local_1e8,&walls_xb);
    std::vector<double,_std::allocator<double>_>::vector(&local_170,&walls_yb);
    dVar8 = DistanceDirSegments(dVar18,dVar12,dVar8,&local_1b8,&local_1d0,&local_1e8,&local_170);
    if (local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_170.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    dVar16 = y_sim;
    dVar9 = x_sim;
    local_398 = alpha_sim + alphas + psi_sim;
    std::vector<double,_std::allocator<double>_>::vector(&local_188,&circles_x);
    std::vector<double,_std::allocator<double>_>::vector(&local_200,&circles_y);
    std::vector<double,_std::allocator<double>_>::vector(&local_1a0,&circles_r);
    dVar9 = DistanceDirCircles(dVar9,dVar16,local_398,&local_188,&local_200,&local_1a0);
    if (local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_200.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_200.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_200.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_200.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_188.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    d_sim = dVar9;
    if (dVar8 <= dVar9) {
      d_sim = dVar8;
    }
    iVar1 = rand();
    if ((double)iVar1 / 2147483647.0 < outliers_ratio) {
      dVar8 = (double)rangescale;
      iVar1 = rand();
      d_sim = ((double)iVar1 * dVar8) / 2147483647.0;
    }
    dVar16 = d_sim;
    dVar9 = d_bias_err;
    dVar8 = d_max_rand_err;
    iVar1 = rand();
    d_mes_simulator =
         (((double)iVar1 + (double)iVar1) / 2147483647.0 + -1.0) * dVar8 + dVar9 + dVar16;
    if (d_mes_simulator <= 0.0) {
      d_mes_simulator = 0.0;
    }
    if (d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
        super__Vector_impl_data._M_start) {
      d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
      super__Vector_impl_data._M_finish =
           d_all_mes_simulator.super__Vector_base<interval,_std::allocator<interval>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    interval::interval(&local_320,&d_mes_simulator);
    std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
              (&d_all_mes_simulator,(vector<interval,_std::allocator<interval>_> *)&local_320);
    if (alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)&alpha_mes_simulator_vector,
                 &alpha_mes_simulator);
    }
    else {
      *alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = alpha_mes_simulator;
      alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           alpha_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    if (d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur ==
        d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
        super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)&d_mes_simulator_vector,&d_mes_simulator);
    }
    else {
      *d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
       super__Deque_impl_data._M_finish._M_cur = d_mes_simulator;
      d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur =
           d_mes_simulator_vector.super__Deque_base<double,_std::allocator<double>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur + 1;
    }
    std::
    deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
    ::push_back(&d_all_mes_simulator_vector,&d_all_mes_simulator);
    local_320.inf = (double)local_298.tv_usec * 1e-06 + (double)local_298.tv_sec;
    std::deque<double,_std::allocator<double>_>::emplace_back<double>
              (&t_simulator_history_vector,&local_320.inf);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&xhat_simulator_history_vector,(value_type *)&xhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&yhat_simulator_history_vector,(value_type *)&yhat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&psihat_simulator_history_vector,(value_type *)&psihat);
    std::deque<interval,_std::allocator<interval>_>::push_back
              (&vrxhat_simulator_history_vector,(value_type *)&vrxhat);
    if (6.283185307179586 / (((double)simulatorperiod / 1000.0) * omegas) <
        (double)(int)((int)((ulong)((long)alpha_mes_simulator_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_start._M_last -
                                   (long)alpha_mes_simulator_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_start._M_cur) >> 3) +
                      (int)((ulong)((long)alpha_mes_simulator_vector.
                                          super__Deque_base<double,_std::allocator<double>_>._M_impl
                                          .super__Deque_impl_data._M_finish._M_cur -
                                   (long)alpha_mes_simulator_vector.
                                         super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                         super__Deque_impl_data._M_finish._M_first) >> 3) +
                     ((((uint)((int)alpha_mes_simulator_vector.
                                    super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                    super__Deque_impl_data._M_finish._M_node -
                              (int)alpha_mes_simulator_vector.
                                   super__Deque_base<double,_std::allocator<double>_>._M_impl.
                                   super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
                     (uint)(alpha_mes_simulator_vector.
                            super__Deque_base<double,_std::allocator<double>_>._M_impl.
                            super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 0x40))
    {
      std::deque<double,_std::allocator<double>_>::pop_front(&alpha_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&d_mes_simulator_vector);
      std::
      deque<std::vector<interval,_std::allocator<interval>_>,_std::allocator<std::vector<interval,_std::allocator<interval>_>_>_>
      ::pop_front(&d_all_mes_simulator_vector);
      std::deque<double,_std::allocator<double>_>::pop_front(&t_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&xhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&yhat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&psihat_simulator_history_vector);
      std::deque<interval,_std::allocator<interval>_>::pop_front(&vrxhat_simulator_history_vector);
    }
    dVar8 = alt_env;
    dVar9 = angle_env;
    local_388 = lat_env;
    local_368 = long_env;
    local_398 = x_sim;
    local_348 = y_sim;
    local_358 = z_sim;
    dVar16 = cos(angle_env);
    local_308._0_8_ = dVar16;
    local_370 = sin(dVar9);
    dVar16 = sin(dVar9);
    dVar9 = cos(dVar9);
    dVar9 = ((dVar16 * local_398 + dVar9 * local_348) / 6371000.0) * 57.29577951308232 + local_388;
    uVar17 = 0;
    if ((2.220446049250313e-16 <= ABS(dVar9 + -90.0)) &&
       (2.220446049250313e-16 <= ABS(dVar9 + 90.0))) {
      local_398 = ((local_398 * (double)local_308._0_8_ - local_348 * local_370) / 6371000.0) *
                  57.29577951308232;
      dVar16 = cos(dVar9 * 0.017453292519943295);
      uVar17 = SUB84(local_368 + local_398 / dVar16,0);
    }
    dVar16 = fmod((-angle_env - psi_sim) + 4.71238898038469,6.283185307179586);
    dVar16 = fmod(dVar16 + 9.42477796076938,6.283185307179586);
    if (pFVar7 != (FILE *)0x0) {
      local_2a0 = local_2a0 + local_288;
      dVar8 = dVar8 + local_358;
      local_398 = ((dVar16 + -3.141592653589793 + 3.141592653589793) * 180.0) / 3.141592653589793;
      local_388 = d_sim;
      dVar16 = fmod((alpha_sim * 180.0) / 3.141592653589793,360.0);
      fmod(dVar16 + 540.0,360.0);
      fprintf(pFVar7,
              "%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;%.3f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.3f;%.3f;\n"
              ,local_2a0,SUB84(dVar9,0),uVar17,dVar8,local_398,0,0,0);
      fflush(pFVar7);
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    dVar8 = local_2b0;
  } while (bExit == 0);
  if ((local_240 == 0) && (iVar1 = clock_gettime(4,(timespec *)&local_320), iVar1 == 0)) {
    local_270 = local_320.inf;
    dStack_268 = local_320.sup;
    local_320.inf =
         (double)((((long)local_320.inf + (long)local_260) - local_280.tv_sec) +
                 ((long)local_320.sup + (long)dStack_258) / 1000000000);
    local_320.sup =
         (double)(((long)local_320.sup + (long)dStack_258) % 1000000000 - local_280.tv_nsec);
    if ((long)local_320.sup < 0) {
      local_320.inf = (double)((long)local_320.inf + ~((ulong)-(long)local_320.sup / 1000000000));
      local_320.sup =
           (double)((long)local_320.sup + 1000000000 +
                   ((ulong)-(long)local_320.sup / 1000000000) * 1000000000);
    }
    local_260 = local_320.inf;
    dStack_258 = local_320.sup;
  }
  GNSSqualitySimulator = 0;
  if (pFVar7 != (FILE *)0x0) {
    fclose(pFVar7);
  }
LAB_00190cdb:
  if (bExit == 0) {
    bExit = 1;
  }
  return (void *)0x0;
}

Assistant:

THREAD_PROC_RETURN_VALUE SimulatorThread(void* pParam)
{
	CHRONO chrono;
	double dt = 0, t = 0, t0 = 0, t_epoch = 0;
	struct timeval tv;

	// Wind, current and waves.
	double psitwind_sim = 0, vtwind_sim = 0;
	double vc = 0, psic = 0, hw = 0;
	
	// Motorboat simulator...
	double alphafvry = 0.1;

	// Sailboat simulator...
	double deltas = 0, phidot = 0;

	// Simulated sonar...
	double d1 = 0, d2 = 0;
	double t_last_stepangles = 0;
	// Temporary...
	double stepangles = (simulatorperiod/1000.0)*omegas;// 0.6;

	double lat = 0, lon = 0, alt = 0, hdg = 0;

	FILE* logsimufile = NULL;
	char logsimufilename[MAX_BUF_LEN];

	UNREFERENCED_PARAMETER(pParam);

	if (!bDisablelogsimu)
	{
		EnterCriticalSection(&strtimeCS);
		sprintf(logsimufilename, LOG_FOLDER"logsimu_%.64s.csv", strtimeex_fns());
		LeaveCriticalSection(&strtimeCS);
		logsimufile = fopen(logsimufilename, "w");
		if (logsimufile == NULL)
		{
			printf("Unable to create log file.\n");
			if (!bExit) bExit = TRUE; // Unexpected program exit...
			return 0;
		}

		fprintf(logsimufile,
			"t_epoch (in s);lat;lon;alt_amsl;hdg;cog;sog;alt_agl;pressure (in bar);fluiddira (in deg);fluidspeeda;fluiddir (in deg);fluidspeed;range;bearing (in deg);elevation (in deg);utc (in ms);"
			"t_app (in s);xhat;yhat;zhat;phihat;thetahat;psihat;vrxhat;vryhat;vrzhat;omegaxhat;omegayhat;omegazhat;accrxhat;accryhat;accrzhat;"
			"xhat_err;yhat_err;zhat_err;phihat_err;thetahat_err;psihat_err;vrxhat_err;vryhat_err;vrzhat_err;omegaxhat_err;omegayhat_err;omegazhat_err;accrxhat_err;accryhat_err;accrzhat_err;"
			"wx;wy;wz;wphi;wtheta;wpsi;wd;wu;wagl;"
			"uvx;uvy;uvz;uwx;uwy;uwz;u1;u2;u3;u4;u5;u6;u7;u8;u9;u10;u11;u12;u13;u14;"
			"EPU1;EPU2;\n"
		);
		fflush(logsimufile);
	}

	GNSSqualitySimulator = GNSS_NO_FIX;

	t = 0;

	x_sim = x_0; y_sim = y_0; z_sim = z_0; phi_sim = phi_0; theta_sim = theta_0; psi_sim = psi_0; vrx_sim = vrx_0; vry_sim = vry_0; vrz_sim = vrz_0; omegax_sim = omegax_0; omegay_sim = omegay_0; omegaz_sim = omegaz_0;
	alpha_mes_simulator = alpha_0; d_sim = d_0;

	StartChrono(&chrono);
	GetTimeElapsedChrono(&chrono, &t);

	t_last_stepangles = t;

	for (;;)
	{
		uSleep(1000*simulatorperiod);
		t0 = t;
		GetTimeElapsedChrono(&chrono, &t);
		dt = t-t0;

		//printf("SimulatorThread period : %f s.\n", dt);

		if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }
		t_epoch = tv.tv_sec+0.000001*tv.tv_usec;
		//utc = 1000.0*tv.tv_sec+0.001*tv.tv_usec;

		EnterCriticalSection(&StateVariablesCS);

		// Simulated environnement evolution (wind, current and waves).
		vtwind_sim = vtwind_med+vtwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psitwind_sim = psitwind_med+psitwind_var*(2.0*rand()/(double)RAND_MAX-1.0);
		vc = vc_med+vc_var*(2.0*rand()/(double)RAND_MAX-1.0);
		psic = psic_med+psic_var*(2.0*rand()/(double)RAND_MAX-1.0);
		hw = hw_var*(2.0*rand()/(double)RAND_MAX-1.0);

		if (robid == SUBMARINE_SIMULATOR_ROBID)
		{
			// z_sim should change when at the surface because of waves, but not underwater...
			// z_mes should change underwater because of waves, but not at the surface...

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+vc*sin(psic);
			double zdot = u3*alphaz+vzup;
			double psidot = (u1-u2)*alphaomegaz;
			//double psidot = omegaz_sim;
			double vrxdot = (u1+u2)*alphavrx-vrx_sim*alphafvrx;
			//double omegazdot = (u1-u2)*alphaomegaz-omegaz_sim*alphafomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = min(z_sim+dt*zdot, 0.0); // z always negative.
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			//omegaz_sim = omegaz_sim+dt*omegazdot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// Pressure sensor.
			// Simplification : on suppose qu'il envoie directement z au lieu de pressure.
			// Les vagues perturbent ses mesures.
			z_pressure = z_sim+z_bias_err+z_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0)+hw+interval(-z_pressure_acc, z_pressure_acc); // Waves influence...
			// GPS available on surface.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0)))&&
				(z_sim >= GPS_submarine_depth_limit))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// DVL.
			if (bEnableSimulatedDVL)
			{
				double vrx_mes = vrx_sim+sensor_err(vrx_bias_err, vrx_max_rand_err);
				double vry_mes = vry_sim+sensor_err(vry_bias_err, vry_max_rand_err);
				double vrz_mes = vrz_sim+sensor_err(vrz_bias_err, vrz_max_rand_err);
				vrx_dvl = interval(vrx_mes-dvl_acc, vrx_mes+dvl_acc);
				vry_dvl = interval(vry_mes-dvl_acc, vry_mes+dvl_acc);
				vrz_dvl = interval(vrz_mes-dvl_acc, vrz_mes+dvl_acc);
			}
			else
			{
				vrx_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vry_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
				vrz_dvl = interval(-MAX_UNCERTAINTY, MAX_UNCERTAINTY);
			}
		}
		else if (robid == MOTORBOAT_SIMULATOR_ROBID)
		{
			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw)+vc*sin(psic);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			double vrxdot = u*alphavrx-vrx_sim*alphafvrx;
			double vrydot = -vry_sim*alphafvry;
			//double xdot = vx_sim;
			//double ydot = vy_sim;
			//double psidot = ;
			//double vrxdot = ;
			//double vrydot = ;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;
			//vx_sim = vx_sim+dt*vxdot;
			//vy_sim = vy_sim+dt*vydot;

			//delta = beta*u(2);
			//theta = x(3);
			//vx = x(4);
			//vy = x(5);
			//xdot = [vx;vy;
			//        (vx*cos(theta)+vy*sin(theta))*sin(delta)/(L/2);
			//        alpha*u(1)*cos(theta)-alphaf*vx;
			//        alpha*u(1)*sin(theta)-alphaf*vy];

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == SAILBOAT_SIMULATOR_ROBID)
		{
			// The model is described in "L. Jaulin Mod�lisation et commande d'un bateau � voile, CIFA2004, Douz (Tunisie)".

			double alphaomegax = 40.0;
			double m = 280.0;
			double Jx = 15.0;
			double Jz = 50.0;
			double l = 0.5;
			double h = 2.1;
			double rr = 1.5;
			double rs = 0.5;
			double leq = 0.2;
			double deltasminreal = 0.30;
			double deltasmaxreal = 1.20;
			double alphaw = 100.0;
			double beta = 0.01;

			double deltar = alphaomegaz*uw;
			double deltasmaxsimu = deltasminreal+u*(deltasmaxreal-deltasminreal);

			double gamma = cos(psi_sim-psitwind_sim)+cos(deltasmaxsimu);
			if (gamma<0) deltas = M_PI-psi_sim+psitwind_sim; // Voile en drapeau.
			else if (sin(psi_sim-psitwind_sim)>0) deltas = deltasmaxsimu; else deltas = -deltasmaxsimu;
			double fg = alphaz*vrx_sim*sin(deltar);
			double fv = alphavrx*vtwind_sim*sin(psi_sim+deltas-psitwind_sim);

			double xdot = vrx_sim*cos(psi_sim)+beta*vtwind_sim*cos(psitwind_sim)+vc*cos(psic);
			double ydot = vrx_sim*sin(psi_sim)+beta*vtwind_sim*sin(psitwind_sim)+vc*sin(psic);
			double vrxdot = (1/m)*(sin(deltas)*fv-sin(deltar)*fg-alphafvrx*vrx_sim*vrx_sim);
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			vrx_sim = vrx_sim+dt*vrxdot;
			psi_sim += omegaz_sim*dt;
			omegaz_sim += (1/Jz)*((l-rs*cos(deltas))*fv-rr*cos(deltar)*fg-alphafomegaz*omegaz_sim+alphaw*hw)*dt;
			phidot += (-alphaomegax*phidot/Jx+fv*h*cos(deltas)*cos(phi_sim)/Jx-m*9.81*leq*sin(phi_sim)/Jx)*dt;
			phi_sim += phidot*dt;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
				sailangle = fmod_360_pos_rad2deg(-angle_env-(psi_sim+deltas)+M_PI/2.0); // Specific to VAIMOS...
				psitwind = psitwind_sim+sensor_err(0, psitwind_var);
				vtwind = vtwind_sim+sensor_err(0, psitwind_var);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}
		else if (robid == TANK_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim);
			double ydot = vrx_sim*sin(psi_sim);
			double psidot = uw*alphaomegaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == BUGGY_SIMULATOR_ROBID)
		{
			vrx_sim = alphavrx*u;

			// Simulated state evolution.
			double xdot = vrx_sim*cos(psi_sim)*cos(alphaomegaz*uw);
			double ydot = vrx_sim*sin(psi_sim)*cos(alphaomegaz*uw);
			double psidot = vrx_sim*sin(alphaomegaz*uw)/alphaz;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			psi_sim = psi_sim+dt*psidot;

			// Simulated sensors measurements.
			// Compass.
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
			// Odometers...
			//vrx_mes = vrx_sim+vrx_bias_err+vrx_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
		}
		else if (robid == QUADRO_SIMULATOR_ROBID)
		{

			//double m = 10, b = 2, delt = 1, l = 1;

			//box sqrtuquadro = box(4);
			//sqrtuquadro[1] = sqrt(u1); sqrtuquadro[2] = sqrt(u2); sqrtuquadro[3] = sqrt(u3); sqrtuquadro[4] = sqrt(u4);
			//box w = 5*sqrtuquadro;

			//imatrix R_Euler = RotationPhiThetaPsi(phi_sim, theta_sim, psi_sim);
			//box Vr = box(vrx_sim, vry_sim, vrz_sim);
			//box pdot = R_Euler*Vr;
			//box p = box(x_sim, y_sim, z_sim);
			//p = p+dt*pdot;
			//x_sim = Center(p[1]);
			//y_sim = Center(p[2]);
			//z_sim = Center(p[3]);

			//rmatrix M = Zeros(3, 3);
			//M.SetVal(1, 1, 1); M.SetVal(1, 2, tan(theta_sim)*sin(phi_sim)); M.SetVal(1, 3, tan(theta_sim)*cos(phi_sim));
			//M.SetVal(2, 1, 0); M.SetVal(2, 2, cos(phi_sim)); M.SetVal(2, 3, -sin(phi_sim));
			//M.SetVal(3, 1, 0); M.SetVal(3, 2, sin(phi_sim)/cos(theta_sim)); M.SetVal(3, 3, cos(phi_sim)/cos(theta_sim));

			//box Wr = box(omegax_sim, omegay_sim, omegaz_sim);
			//box anglesdot = imatrix(M)*Wr;
			//box angles = box(phi_sim, theta_sim, psi_sim);
			//angles = angles+dt*anglesdot;
			//phi_sim = Center(angles[1]);
			//theta_sim = Center(angles[2]);
			//psi_sim = Center(angles[3]);
			//
			//rmatrix B = Zeros(4, 4);
			//B.SetVal(1, 1, b); B.SetVal(1, 2, b); B.SetVal(1, 3, b); B.SetVal(1, 4, b);
			//B.SetVal(2, 1, -b*l); B.SetVal(2, 2, 0); B.SetVal(2, 3, b*l); B.SetVal(2, 4, 0);
			//B.SetVal(3, 1, 0); B.SetVal(3, 2, -b*l); B.SetVal(3, 3, 0); B.SetVal(3, 4, b*l);
			//B.SetVal(4, 1, -delt); B.SetVal(4, 2, delt); B.SetVal(4, 3, -delt); B.SetVal(4, 4, delt);

			//box wabsw = box(4);
			//wabsw[1] = w[1]*Abs(w[1]); wabsw[2] = w[2]*Abs(w[2]); wabsw[3] = w[3]*Abs(w[3]); wabsw[4] = w[4]*Abs(w[4]);

			//box tau = imatrix(B)*wabsw;

			//box Vrdot = Transpose(R_Euler)*box(0, 0, STANDARD_GRAVITY)+box(0, 0, -tau[1]/m)-box(Wr[2]*Vr[3]-Wr[3]*Vr[2], Wr[3]*Vr[1]-Wr[1]*Vr[3], Wr[1]*Vr[2]-Wr[2]*Vr[1]);
			//Vr = Vr+dt*Vrdot;
			//vrx_sim = Center(Vr[1]);
			//vry_sim = Center(Vr[2]);
			//vrz_sim = Center(Vr[3]);

			//rmatrix I = Zeros(3, 3);
			//I.SetVal(1, 1, 10); I.SetVal(1, 2, 0); I.SetVal(1, 3, 0);
			//I.SetVal(2, 1, 0); I.SetVal(2, 2, 10); I.SetVal(2, 3, 0);
			//I.SetVal(3, 1, 0); I.SetVal(3, 2, 0); I.SetVal(3, 3, 20);

			//box IWr = imatrix(I)*Wr;
			//box Wrdot = imatrix(Inv(I))*(box(tau[2], tau[3], tau[4])-box(Wr[2]*IWr[3]-Wr[3]*IWr[2], Wr[3]*IWr[1]-Wr[1]*IWr[3], Wr[1]*IWr[2]-Wr[2]*IWr[1]));
			//Wr = Wr+dt*Wrdot;
			//omegax_sim = Center(Wr[1]);
			//omegay_sim = Center(Wr[2]);
			//omegaz_sim = Center(Wr[3]);

			// Not fully implemented...

			// Simulated state evolution.
			double xdot = vrx_sim;
			double ydot = vry_sim;
			double zdot = u3*alphaz;
			double psidot = alphaomegaz*uw;
			double vrxdot = alphavrx*u*cos(psi_sim)-alphavrx*ul*sin(psi_sim)-alphafvrx*vrx_sim;
			double vrydot = alphavrx*u*sin(psi_sim)+alphavrx*ul*cos(psi_sim)-alphafvry*vry_sim;
			x_sim = x_sim+dt*xdot;
			y_sim = y_sim+dt*ydot;
			z_sim = z_sim+dt*zdot;
			psi_sim = psi_sim+dt*psidot;
			vrx_sim = vrx_sim+dt*vrxdot;
			vry_sim = vry_sim+dt*vrydot;

			// Simulated sensors measurements.
			// AHRS.
			phi_ahrs = phi_sim+sensor_err(phi_bias_err, phi_max_rand_err)+interval(-phi_ahrs_acc, phi_ahrs_acc);
			theta_ahrs = theta_sim+sensor_err(theta_bias_err, theta_max_rand_err)+interval(-theta_ahrs_acc, theta_ahrs_acc);
			psi_ahrs = psi_sim+sensor_err(psi_bias_err, psi_max_rand_err)+interval(-psi_ahrs_acc, psi_ahrs_acc);
			// GPS.
			if ((bEnableSimulatedGNSS)&&
				((!bNoSimGNSSInsideObstacles)||((bNoSimGNSSInsideObstacles)&&(CheckInsideObstacle(x_sim, y_sim, false) < 0))))
			{
				GNSSqualitySimulator = AUTONOMOUS_GNSS_FIX;
				double x_gps_mes = x_sim+sensor_err(x_bias_err, x_max_rand_err);
				double y_gps_mes = y_sim+sensor_err(y_bias_err, y_max_rand_err);
				double z_gps_mes = 0+5*x_max_rand_err*(2.0*rand()/(double)RAND_MAX-1.0);
				double lat_gps_mes = 0, lon_gps_mes = 0, alt_gps_mes = 0;
				EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_gps_mes, y_gps_mes, z_gps_mes, &lat_gps_mes, &lon_gps_mes, &alt_gps_mes);
				ComputeGNSSPosition(lat_gps_mes, lon_gps_mes, alt_gps_mes, GNSSqualitySimulator, 0, 0);
				sog = sqrt(sqr(xdot)+sqr(ydot));
				cog_gps = atan2(ydot, xdot)+interval(-M_PI, M_PI);
			}
			else
			{
				GNSSqualitySimulator = GNSS_NO_FIX;
			}
		}

		// Sonar.
		//for (;;)
		{
		//if (t-t_last_stepangles <= stepangles/omegas) break;

		// nsteps == 2*M_PI/stepangles
		// Previously, stepangles == (simulatorperiod/1000.0)*omegas
		
		t_last_stepangles += stepangles/omegas;
		//alpha_mes_simulator = alpha_mes_simulator+stepangles;
		alpha_mes_simulator = alpha_mes_simulator+(simulatorperiod/1000.0)*omegas;
		if (alpha_mes_simulator > 2*M_PI+alpha_0)
		{
			alpha_mes_simulator = alpha_0;
		}
		alpha_sim = alpha_mes_simulator-sensor_err(alpha_bias_err, alpha_max_rand_err);
		// Compute the distance to the first obstacle d. d might be oo if no obstacle found.
		d1 = DistanceDirSegments(x_sim, y_sim, alpha_sim+alphas+psi_sim, walls_xa, walls_ya, walls_xb, walls_yb);
		d2 = DistanceDirCircles(x_sim, y_sim, alpha_sim+alphas+psi_sim, circles_x, circles_y, circles_r);
		d_sim = min(d1, d2);

		// Generate outliers.
		if ((double)rand()/(double)RAND_MAX < outliers_ratio)
		{
			d_sim = rangescale*(double)rand()/(double)RAND_MAX;
		}

		d_mes_simulator = d_sim+sensor_err(d_bias_err, d_max_rand_err);
		d_mes_simulator = max(0.0, d_mes_simulator);
		//d_mes_simulator = max(0.0, min((double)rangescale, d_mes_simulator));

		// For compatibility with a Seanet...
		d_all_mes_simulator.clear();
		/*
		// Outlier before the wall.
		d_all_mes_simulator.push_back(d_mes_simulator*(double)rand()/(double)RAND_MAX);
		*/
		// Wall (or sometimes also an outlier...).
		d_all_mes_simulator.push_back(d_mes_simulator);
		/*
		// Outlier after the wall.
		d_all_mes_simulator.push_back(d_mes_simulator+(rangescale-d_mes_simulator)*(double)rand()/(double)RAND_MAX);
		*/

		alpha_mes_simulator_vector.push_back(alpha_mes_simulator);
		d_mes_simulator_vector.push_back(d_mes_simulator);
		d_all_mes_simulator_vector.push_back(d_all_mes_simulator);
		t_simulator_history_vector.push_back(tv.tv_sec+0.000001*tv.tv_usec);
		xhat_simulator_history_vector.push_back(xhat);
		yhat_simulator_history_vector.push_back(yhat);
		psihat_simulator_history_vector.push_back(psihat);
		vrxhat_simulator_history_vector.push_back(vrxhat);

		if ((int)alpha_mes_simulator_vector.size() > 2*M_PI/((simulatorperiod/1000.0)*omegas))
		{
			alpha_mes_simulator_vector.pop_front();
			d_mes_simulator_vector.pop_front();
			d_all_mes_simulator_vector.pop_front();
			t_simulator_history_vector.pop_front();
			xhat_simulator_history_vector.pop_front();
			yhat_simulator_history_vector.pop_front();
			psihat_simulator_history_vector.pop_front();
			vrxhat_simulator_history_vector.pop_front();
		}
		}

		EnvCoordSystem2GPS(lat_env, long_env, alt_env, angle_env, x_sim, y_sim, z_sim, &lat, &lon, &alt);
		hdg = (fmod_2PI(-angle_env-psi_sim+3.0*M_PI/2.0)+M_PI)*180.0/M_PI;

		if (logsimufile)
		{
			fprintf(logsimufile,
				"%f;%.8f;%.8f;%.3f;%.2f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;%.3f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;"
				"%.3f;%.3f;\n",
				t_epoch, lat, lon, alt, hdg, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, d_sim, fmod_360_rad2deg(alpha_sim), 0.0, utc,
				t, x_sim, y_sim, z_sim, 0.0, 0.0, psi_sim,
				vrx_sim, 0.0, 0.0, 0.0, 0.0, omegaz_sim, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0, 0.0, 0.0, 0.0, 0.0, u1, u2, u3, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0, 0.0,
				0.0, 0.0);
			fflush(logsimufile);
		}

		LeaveCriticalSection(&StateVariablesCS);

		if (bExit) break;
	}

	StopChrono(&chrono, &t);

	GNSSqualitySimulator = GNSS_NO_FIX;

	if (logsimufile)
	{
		fclose(logsimufile);
	}

	if (!bExit) bExit = TRUE; // Unexpected program exit...

	return 0;
}